

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O2

void __thiscall MinVR::VRDisplayNode::clearChildren(VRDisplayNode *this,bool destroyChildren)

{
  pointer ppVVar1;
  undefined3 in_register_00000031;
  pointer ppVVar2;
  
  if (CONCAT31(in_register_00000031,destroyChildren) == 0) {
    ppVVar2 = (this->_children).
              super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    for (ppVVar2 = (this->_children).
                   super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVVar2 !=
        (this->_children).
        super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppVVar2 = ppVVar2 + 1) {
      if (*ppVVar2 != (VRDisplayNode *)0x0) {
        (*(*ppVVar2)->_vptr_VRDisplayNode[1])();
      }
    }
  }
  ppVVar1 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar2 != ppVVar1) {
    (this->_children).
    super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar1;
  }
  return;
}

Assistant:

void VRDisplayNode::clearChildren(bool destroyChildren) {
	if (destroyChildren) {
		for (std::vector<VRDisplayNode*>::iterator it = _children.begin(); it != _children.end(); it++) {
				delete (*it);
		}
	}

	_children.clear();
}